

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Players.cpp
# Opt level: O0

void Handlers::Players_List(EOClient *client,PacketReader *reader)

{
  World *pWVar1;
  Character *pCVar2;
  bool bVar3;
  PacketAction PVar4;
  int iVar5;
  EOServer *pEVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  vector<Character_*,_std::allocator<Character_*>_> *pvVar9;
  long lVar10;
  reference ppCVar11;
  bool bVar12;
  long local_338;
  size_type local_290;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined4 local_1e4;
  undefined1 local_1e0 [8];
  string name_suffix;
  bool hide_admin;
  bool hide_online_1;
  Character *character_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1_1;
  PacketBuilder reply;
  string local_160;
  undefined1 local_140 [8];
  string hidden_admin_suffix;
  bool is_friends_list;
  bool hide_online;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  int online;
  allocator<char> local_c9;
  key_type local_c8;
  undefined1 local_a8 [8];
  anon_class_24_3_cad2cfe9 really_hidden;
  key_type local_88;
  int local_68 [2];
  int cmdprotect;
  allocator<char> local_51;
  key_type local_50;
  int local_2c;
  size_type sStack_28;
  int seehide;
  Character *from_character;
  Player *from_player;
  PacketReader *reader_local;
  EOClient *client_local;
  
  from_character = (Character *)client->player;
  if (from_character == (Character *)0x0) {
    local_290 = 0;
  }
  else {
    local_290 = (from_character->home).field_2._M_allocated_capacity;
  }
  sStack_28 = local_290;
  from_player = (Player *)reader;
  reader_local = (PacketReader *)client;
  pEVar6 = EOClient::server(client);
  pWVar1 = pEVar6->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"seehide",&local_51);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->admin_config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_50);
  iVar5 = util::variant::operator_cast_to_int(pmVar7);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_2c = iVar5;
  pEVar6 = EOClient::server((EOClient *)reader_local);
  pWVar1 = pEVar6->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"cmdprotect",
             (allocator<char> *)((long)&really_hidden.cmdprotect + 7));
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->admin_config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_88);
  iVar5 = util::variant::operator_cast_to_int(pmVar7);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&really_hidden.cmdprotect + 7));
  local_a8 = (undefined1  [8])&stack0xffffffffffffffd8;
  really_hidden.from_character = (Character **)&local_2c;
  really_hidden.seehide = local_68;
  local_68[0] = iVar5;
  pEVar6 = EOClient::server((EOClient *)reader_local);
  pWVar1 = pEVar6->world;
  std::allocator<char>::allocator();
  __range1._6_1_ = 0;
  __range1._5_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"SLN",&local_c9);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_c8);
  bVar3 = util::variant::operator_cast_to_bool(pmVar7);
  bVar12 = false;
  if (!bVar3) {
    pEVar6 = EOClient::server((EOClient *)reader_local);
    pWVar1 = pEVar6->world;
    std::allocator<char>::allocator();
    __range1._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&online,"AllowStats",(allocator<char> *)((long)&__range1 + 7));
    __range1._5_1_ = 1;
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,(key_type *)&online);
    bVar3 = util::variant::operator_cast_to_bool(pmVar7);
    bVar12 = false;
    if (!bVar3) {
      bVar12 = sStack_28 == 0;
    }
  }
  if ((__range1._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&online);
  }
  if ((__range1._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  if (!bVar12) {
    pEVar6 = EOClient::server((EOClient *)reader_local);
    sVar8 = std::vector<Character_*,_std::allocator<Character_*>_>::size(&pEVar6->world->characters)
    ;
    __range1._0_4_ = (int)sVar8;
    pEVar6 = EOClient::server((EOClient *)reader_local);
    pvVar9 = &pEVar6->world->characters;
    __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(pvVar9);
    character = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(pvVar9);
    while (bVar12 = __gnu_cxx::operator!=
                              (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                        *)&character), bVar12) {
      ppCVar11 = __gnu_cxx::
                 __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                 ::operator*(&__end1);
      pCVar2 = *ppCVar11;
      hidden_admin_suffix.field_2._M_local_buf[0xf] = Character::IsHideOnline(pCVar2);
      if (((bool)hidden_admin_suffix.field_2._M_local_buf[0xf]) &&
         (bVar12 = Players_List::anon_class_24_3_cad2cfe9::operator()
                             ((anon_class_24_3_cad2cfe9 *)local_a8,pCVar2), bVar12)) {
        __range1._0_4_ = (int)__range1 + -1;
      }
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end1);
    }
    PVar4 = PacketReader::Action((PacketReader *)from_player);
    hidden_admin_suffix.field_2._M_local_buf[0xe] = PVar4 == PACKET_LIST;
    pEVar6 = EOClient::server((EOClient *)reader_local);
    pWVar1 = pEVar6->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"hidden_admin_suffix",
               (allocator<char> *)((long)&reply.add_size + 7));
    I18N::Format<>((string *)local_140,&pWVar1->i18n,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)((long)&reply.add_size + 7));
    lVar10 = (long)(int)__range1;
    if ((hidden_admin_suffix.field_2._M_local_buf[0xe] & 1U) == 0) {
      local_338 = std::__cxx11::string::length();
      local_338 = local_338 + 0x24;
    }
    else {
      local_338 = 0xd;
    }
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)&__range1_1,PACKET_F_INIT,PACKET_A_INIT,lVar10 * local_338 + 4);
    PacketBuilder::AddChar
              ((PacketBuilder *)&__range1_1,
               ((byte)hidden_admin_suffix.field_2._M_local_buf[0xe] & 1) * 2 + 8);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_1,(int)__range1);
    PacketBuilder::AddByte((PacketBuilder *)&__range1_1,0xff);
    pEVar6 = EOClient::server((EOClient *)reader_local);
    pvVar9 = &pEVar6->world->characters;
    __end1_1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(pvVar9);
    character_1 = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(pvVar9);
    while (bVar12 = __gnu_cxx::operator!=
                              (&__end1_1,
                               (__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                *)&character_1), bVar12) {
      ppCVar11 = __gnu_cxx::
                 __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                 ::operator*(&__end1_1);
      pCVar2 = *ppCVar11;
      name_suffix.field_2._M_local_buf[0xf] = Character::IsHideOnline(pCVar2);
      name_suffix.field_2._M_local_buf[0xe] = Character::IsHideAdmin(pCVar2);
      std::__cxx11::string::string((string *)local_1e0);
      if (((name_suffix.field_2._M_local_buf[0xf] & 1U) == 0) ||
         (bVar12 = Players_List::anon_class_24_3_cad2cfe9::operator()
                             ((anon_class_24_3_cad2cfe9 *)local_a8,pCVar2), !bVar12)) {
        if ((name_suffix.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::operator+(&local_208," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140);
          std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_208);
          std::__cxx11::string::~string((string *)&local_208);
        }
        (*(pCVar2->super_Command_Source)._vptr_Command_Source[2])(&local_248);
        std::operator+(&local_228,&local_248,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0);
        PacketBuilder::AddBreakString((PacketBuilder *)&__range1_1,&local_228,0xff);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        if ((hidden_admin_suffix.field_2._M_local_buf[0xe] & 1U) == 0) {
          PacketBuilder::AddBreakString((PacketBuilder *)&__range1_1,&pCVar2->title,0xff);
          PacketBuilder::AddChar((PacketBuilder *)&__range1_1,0);
          if (((pCVar2->bot & 1U) == 0) || (sStack_28 != 0)) {
            if ((pCVar2->admin < ADMIN_HGM) || ((name_suffix.field_2._M_local_buf[0xe] & 1U) != 0))
            {
              if ((pCVar2->admin == ADMIN_PLAYER) ||
                 ((name_suffix.field_2._M_local_buf[0xe] & 1U) != 0)) {
                if (pCVar2->party == (Party *)0x0) {
                  PacketBuilder::AddChar((PacketBuilder *)&__range1_1,0);
                }
                else {
                  PacketBuilder::AddChar((PacketBuilder *)&__range1_1,6);
                }
              }
              else if (pCVar2->party == (Party *)0x0) {
                PacketBuilder::AddChar((PacketBuilder *)&__range1_1,4);
              }
              else {
                PacketBuilder::AddChar((PacketBuilder *)&__range1_1,9);
              }
            }
            else if (pCVar2->party == (Party *)0x0) {
              PacketBuilder::AddChar((PacketBuilder *)&__range1_1,5);
            }
            else {
              PacketBuilder::AddChar((PacketBuilder *)&__range1_1,10);
            }
          }
          else {
            PacketBuilder::AddChar((PacketBuilder *)&__range1_1,0x14);
          }
          PacketBuilder::AddChar((PacketBuilder *)&__range1_1,(uint)pCVar2->clas);
          Character::PaddedGuildTag_abi_cxx11_(&local_268,pCVar2);
          PacketBuilder::AddString((PacketBuilder *)&__range1_1,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          PacketBuilder::AddByte((PacketBuilder *)&__range1_1,0xff);
        }
        else {
          (*(pCVar2->super_Command_Source)._vptr_Command_Source[2])(&local_288);
          PacketBuilder::AddBreakString((PacketBuilder *)&__range1_1,&local_288,0xff);
          std::__cxx11::string::~string((string *)&local_288);
        }
        local_1e4 = 0;
      }
      else {
        local_1e4 = 5;
      }
      std::__cxx11::string::~string((string *)local_1e0);
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end1_1);
    }
    EOClient::Send((EOClient *)reader_local,(PacketBuilder *)&__range1_1);
    PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1_1);
    std::__cxx11::string::~string((string *)local_140);
  }
  return;
}

Assistant:

void Players_List(EOClient *client, PacketReader &reader)
{
	Player* from_player = client->player;
	Character* from_character = from_player ? from_player->character : nullptr;
	int seehide = client->server()->world->admin_config["seehide"];
	int cmdprotect = client->server()->world->admin_config["cmdprotect"];

	auto really_hidden = [&](const Character* character)
	{
		return !(from_character && (
		       from_character == character
		    || (from_character->admin >= seehide && character->admin < cmdprotect)
		    || (from_character->admin >= seehide && character->admin >= cmdprotect && from_character->admin > character->admin)
		));
	};

	if (!client->server()->world->config["SLN"] && !client->server()->world->config["AllowStats"] && !from_character)
	{
		return;
	}

	int online = client->server()->world->characters.size();

	UTIL_FOREACH(client->server()->world->characters, character)
	{
		bool hide_online = character->IsHideOnline();

		if (hide_online && really_hidden(character))
			--online;
	}

	bool is_friends_list = (reader.Action() == PACKET_LIST);
	std::string hidden_admin_suffix = client->server()->world->i18n.Format("hidden_admin_suffix");

	PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 4 + online * (is_friends_list ? 13 : (36 + hidden_admin_suffix.length())));
	reply.AddChar(is_friends_list ? INIT_FRIEND_LIST_PLAYERS : INIT_PLAYERS);
	reply.AddShort(online);
	reply.AddByte(255);
	UTIL_FOREACH(client->server()->world->characters, character)
	{
		bool hide_online = character->IsHideOnline();
		bool hide_admin = character->IsHideAdmin();

		std::string name_suffix;

		if (hide_online && really_hidden(character))
			continue;

		if (hide_online)
			name_suffix = " " + hidden_admin_suffix;

		reply.AddBreakString(character->SourceName() + name_suffix);

		// Full information is not sent for friends list requests
		if (!is_friends_list)
		{
			reply.AddBreakString(character->title);
			reply.AddChar(0); // ?
			if (character->bot && !from_character)
			{
				reply.AddChar(ICON_SLN_BOT);
			}
			else if (character->admin >= ADMIN_HGM && !hide_admin)
			{
				if (character->party)
				{
					reply.AddChar(ICON_HGM_PARTY);
				}
				else
				{
					reply.AddChar(ICON_HGM);
				}
			}
			else if (character->admin >= ADMIN_GUIDE && !hide_admin)
			{
				if (character->party)
				{
					reply.AddChar(ICON_GM_PARTY);
				}
				else
				{
					reply.AddChar(ICON_GM);
				}
			}
			else
			{
				if (character->party)
				{
					reply.AddChar(ICON_PARTY);
				}
				else
				{
					reply.AddChar(ICON_NORMAL);
				}
			}
			reply.AddChar(character->clas);
			reply.AddString(character->PaddedGuildTag());
			reply.AddByte(255);
		}
		else
		{
			reply.AddBreakString(character->SourceName());
		}
	}

	client->Send(reply);
}